

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O0

char * sockaddr_get_addrstr(sockaddr *sa,char *addrstr,int addrstrlen)

{
  char *pcVar1;
  sockaddr_in *sa4;
  sockaddr_in6 *sa6;
  void *addr;
  int addrstrlen_local;
  char *addrstr_local;
  sockaddr *sa_local;
  
  *addrstr = '\0';
  if (sa->sa_family == 10) {
    sa6 = (sockaddr_in6 *)(sa->sa_data + 6);
  }
  else {
    if (sa->sa_family != 2) {
      return (char *)0x0;
    }
    sa6 = (sockaddr_in6 *)(sa->sa_data + 2);
  }
  pcVar1 = inet_ntop((uint)sa->sa_family,sa6,addrstr,addrstrlen);
  return pcVar1;
}

Assistant:

const char* sockaddr_get_addrstr(const struct sockaddr *sa, char *addrstr,
    int addrstrlen)
{
    const void *addr;
    addrstr[0] = '\0';
    if (sa->sa_family == AF_INET6)
    {
        struct sockaddr_in6 *sa6 = (struct sockaddr_in6 *)sa;
        addr = (const void *)&sa6->sin6_addr.s6_addr;
    }
    else if (sa->sa_family == AF_INET)
    {
        struct sockaddr_in *sa4 = (struct sockaddr_in *)sa;
        addr = (const void *)&sa4->sin_addr.s_addr;
    }
    else return NULL;
    return INET_NTOP(sa->sa_family, addr, addrstr, addrstrlen);
}